

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_klass.cpp
# Opt level: O0

void __thiscall
HawkTracer::parser::EventKlass::add_field
          (EventKlass *this,
          unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
          *field)

{
  bool bVar1;
  shared_ptr<HawkTracer::parser::EventKlassField> local_70 [2];
  undefined1 local_50 [32];
  undefined1 local_30 [24];
  lock_guard<std::mutex> l;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  *field_local;
  EventKlass *this_local;
  
  l._M_device = (mutex_type *)field;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)(local_30 + 0x10),&this->_fields_mtx);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::operator->(field);
  EventKlassField::get_name_abi_cxx11_((EventKlassField *)local_50);
  bVar1 = (bool)std::__cxx11::string::c_str();
  _get_field((EventKlass *)local_30,(char *)this,bVar1);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  std::shared_ptr<const_HawkTracer::parser::EventKlassField>::~shared_ptr
            ((shared_ptr<const_HawkTracer::parser::EventKlassField> *)local_30);
  std::__cxx11::string::~string((string *)local_50);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::shared_ptr<HawkTracer::parser::EventKlassField>::
    shared_ptr<HawkTracer::parser::EventKlassField,std::default_delete<HawkTracer::parser::EventKlassField>,void>
              (local_70,field);
    std::
    vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
    ::push_back(&this->_fields,local_70);
    std::shared_ptr<HawkTracer::parser::EventKlassField>::~shared_ptr(local_70);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)(local_30 + 0x10));
  return;
}

Assistant:

void EventKlass::add_field(std::unique_ptr<EventKlassField> field)
{
    std::lock_guard<std::mutex> l(_fields_mtx);
    if (!_get_field(field->get_name().c_str(), false))
    {
        _fields.push_back(std::move(field));
    }
}